

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distribution.cpp
# Opt level: O2

float __thiscall NormalDistribution::getRandomNumber(NormalDistribution *this)

{
  uniform_real_distribution<double> *this_00;
  mt19937 *__urng;
  float fVar1;
  result_type_conflict1 rVar2;
  double dVar3;
  bool bVar4;
  float fVar5;
  float local_38;
  
  this_00 = &(this->super_Distribution).distrib;
  __urng = &(this->super_Distribution).gen;
  bVar4 = false;
  while( true ) {
    rVar2 = std::uniform_real_distribution<double>::operator()(this_00,__urng);
    fVar5 = (float)rVar2;
    if (bVar4) break;
    rVar2 = std::uniform_real_distribution<double>::operator()(this_00,__urng);
    dVar3 = log((double)fVar5);
    dVar3 = exp((-1.0 - dVar3) * (-1.0 - dVar3) * -0.5);
    bVar4 = (double)(float)rVar2 <= dVar3;
    local_38 = fVar5;
  }
  fVar1 = this->sigma;
  dVar3 = log((double)local_38);
  return (float)(dVar3 * (double)(float)(~-(uint)(fVar5 < 0.5) & (uint)-fVar1 |
                                        (uint)fVar1 & -(uint)(fVar5 < 0.5)) + (double)this->mu);
}

Assistant:

float NormalDistribution::getRandomNumber() {
	float u1;
	float u2;
	float u3;
	bool accepted = false;

	while(!accepted){
		u1 = this->distrib(gen);
		u2 = this->distrib(gen);
		if (u2 <= exp(-0.5*pow(-log(u1)-1,2))){
			accepted = true;
		}
	}

	u3 = this->distrib(gen);
	if (u3 < 0.5) return sigma*log(u1)+mu;
	else return -sigma*log(u1)+mu;
}